

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cc
# Opt level: O2

void __thiscall tt::AsyncLogging::append(AsyncLogging *this,char *logline,int len)

{
  BufferPtr *this_00;
  element_type *peVar1;
  char *pcVar2;
  FixedBuffer<4000000> *__p;
  char **ppcVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  peVar1 = (this->m_currentBuffer).
           super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = peVar1->m_cur;
  ppcVar3 = &peVar1->m_cur;
  if (len < (int)ppcVar3 - (int)pcVar2) {
    memcpy(pcVar2,logline,(long)len);
    *ppcVar3 = *ppcVar3 + len;
  }
  else {
    this_00 = &this->m_currentBuffer;
    std::
    vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>>,std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>>>>
    ::emplace_back<std::shared_ptr<tt::detail::FixedBuffer<4000000>>>
              ((vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>>,std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>>>>
                *)&this->m_buffers,this_00);
    if ((this->m_nextBuffer).
        super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __p = (FixedBuffer<4000000> *)operator_new(0x3d0908);
      __p->m_cur = (char *)__p;
      std::__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
      reset<tt::detail::FixedBuffer<4000000>>
                ((__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)
                 this_00,__p);
    }
    else {
      std::__shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->
                  super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->m_nextBuffer).
                  super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>);
    }
    peVar1 = (this_00->
             super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pcVar2 = peVar1->m_cur;
    ppcVar3 = &peVar1->m_cur;
    if (len < (int)ppcVar3 - (int)pcVar2) {
      memcpy(pcVar2,logline,(long)len);
      *ppcVar3 = *ppcVar3 + len;
    }
    pthread_cond_signal((pthread_cond_t *)&(this->m_cond).m_cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void AsyncLogging::append(const char* logline, int len){
	tt::MutexLockGuard lock(m_mutex);


	//如果当前缓冲区剩余空间足够大(可以容纳下当前日志的大小)
	
	if(m_currentBuffer->avail() > len){
		m_currentBuffer->append(logline,len);
	}else{
		m_buffers.push_back(std::move(m_currentBuffer));

		if(m_nextBuffer){
			m_currentBuffer = std::move(m_nextBuffer);
		}else{
			m_currentBuffer.reset(new Buffer);
		}

		m_currentBuffer->append(logline,len);
		m_cond.notify();
	}
	
}